

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall Imf_2_5::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  pointer ppDVar1;
  pointer ppDVar2;
  int iVar3;
  uint uVar4;
  ChannelList *pCVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  undefined8 uVar8;
  ConstIterator CVar9;
  Header *this_00;
  Box2i *pBVar10;
  Box2i *pBVar11;
  ArgExc *this_01;
  bool bVar12;
  char *pcVar13;
  string n;
  allocator<char> local_5d;
  uint local_5c;
  Data *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pCVar5 = Header::channels(header);
  cVar6._M_node = (_Base_ptr)ChannelList::begin(pCVar5);
  pCVar5 = Header::channels(header);
  cVar7._M_node = (_Base_ptr)ChannelList::end(pCVar5);
  if (cVar6._M_node == cVar7._M_node) {
    bVar12 = false;
    uVar4 = 0;
  }
  else {
    local_5c = 0;
    bVar12 = false;
    local_58 = this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,(char *)(cVar6._M_node + 1),&local_5d);
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      if (iVar3 == 0) {
        local_58->_zback = true;
      }
      else {
        uVar8 = std::__cxx11::string::compare((char *)local_50);
        if ((int)uVar8 == 0) {
          local_5c = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_50);
          if (iVar3 == 0) {
            bVar12 = true;
          }
        }
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
      pCVar5 = Header::channels(header);
      CVar9 = ChannelList::end(pCVar5);
      this = local_58;
      uVar4 = local_5c;
    } while ((const_iterator)cVar6._M_node != CVar9._i._M_node);
  }
  if ((uVar4 & 1) == 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar13 = "Deep data provided to CompositeDeepScanLine is missing a Z channel";
    goto LAB_0016e072;
  }
  if (!bVar12) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar13 = "Deep data provided to CompositeDeepScanLine is missing an alpha channel";
    goto LAB_0016e072;
  }
  ppDVar1 = (this->_part).
            super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppDVar2 = (this->_part).
            super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar2 == ppDVar1) {
    if ((this->_file).
        super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_file).
        super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pBVar10 = Header::dataWindow(header);
      (this->_dataWindow).min = pBVar10->min;
      (this->_dataWindow).max = pBVar10->max;
      return;
    }
    if (ppDVar2 != ppDVar1) goto LAB_0016df35;
    this_00 = DeepScanLineInputFile::header
                        (*(this->_file).
                          super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
LAB_0016df35:
    this_00 = DeepScanLineInputPart::header(*ppDVar1);
  }
  pBVar10 = Header::displayWindow(this_00);
  pBVar11 = Header::displayWindow(header);
  if (((((pBVar10->min).x == (pBVar11->min).x) && ((pBVar10->min).y == (pBVar11->min).y)) &&
      ((pBVar10->max).x == (pBVar11->max).x)) && ((pBVar10->max).y == (pBVar11->max).y)) {
    pBVar10 = Header::dataWindow(header);
    iVar3 = (pBVar10->min).x;
    if (iVar3 < (this->_dataWindow).min.x) {
      (this->_dataWindow).min.x = iVar3;
    }
    iVar3 = (pBVar10->max).x;
    if ((this->_dataWindow).max.x < iVar3) {
      (this->_dataWindow).max.x = iVar3;
    }
    iVar3 = (pBVar10->min).y;
    if (iVar3 < (this->_dataWindow).min.y) {
      (this->_dataWindow).min.y = iVar3;
    }
    iVar3 = (pBVar10->max).y;
    if ((this->_dataWindow).max.y < iVar3) {
      (this->_dataWindow).max.y = iVar3;
    }
    return;
  }
  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
  pcVar13 = 
  "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data"
  ;
LAB_0016e072:
  Iex_2_5::ArgExc::ArgExc(this_01,pcVar13);
  __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid(const Header & header)
{

    bool has_z=false;
    bool has_alpha=false;
    // check good channel names
    for( ChannelList::ConstIterator i=header.channels().begin();i!=header.channels().end();++i)
    {
        std::string n(i.name()); 
        if(n=="ZBack")
        {
            _zback=true;
        }
        else if(n=="Z")
        {
            has_z=true;
        }
        else if(n=="A")
        {
            has_alpha=true;
        }
    }
    
    if(!has_z)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }
    
    if(!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }
    
    
    if(_part.size()==0 && _file.size()==0)
    {
       // first in - update and return

       _dataWindow = header.dataWindow();
       
       return;
    }
    
    
    const Header * const match_header = _part.size()>0 ? &_part[0]->header() : &_file[0]->header();
    
    // check the sizes match
    if(match_header->displayWindow() != header.displayWindow())
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }
    
    _dataWindow.extendBy(header.dataWindow());
    
}